

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::ComputeAllConfigSources(cmGeneratorTarget *this)

{
  KindedSources *pKVar1;
  bool bVar2;
  KindedSources *pKVar3;
  reference config;
  pointer pSVar4;
  size_type sVar5;
  pointer ppVar6;
  reference pvVar7;
  __enable_if_t<is_constructible<value_type,_pair<const_cmSourceFile_*const,_unsigned_long>_&>::value,_pair<iterator,_bool>_>
  _Var8;
  unsigned_long local_f8;
  undefined1 local_f0 [8];
  value_type entry;
  AllConfigSource acs;
  _Self local_b0;
  iterator mi;
  __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
  local_a0;
  const_iterator si;
  KindedSources *sources;
  size_t ci;
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  index;
  string local_48;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorTarget *this_local;
  
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  cmMakefile::GetConfigurations
            (&local_48,this->Makefile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  ::map((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
         *)&ci);
  for (sources = (KindedSources *)0x0; pKVar1 = sources,
      pKVar3 = (KindedSources *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_28), pKVar1 < pKVar3;
      sources = (KindedSources *)
                ((long)&(sources->Sources).
                        super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1)) {
    config = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_28,(size_type)sources);
    si._M_current = (SourceAndKind *)GetKindedSources(this,config);
    local_a0._M_current =
         (SourceAndKind *)
         std::
         vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
         ::begin((vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                  *)si._M_current);
    while( true ) {
      mi._M_node = (_Base_ptr)
                   std::
                   vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                   ::end((vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                          *)si._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_a0,
                         (__normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                          *)&mi);
      if (!bVar2) break;
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
               ::operator->(&local_a0);
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
           ::find((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                   *)&ci,&pSVar4->Source);
      acs.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                    ::end((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                           *)&ci);
      bVar2 = std::operator==(&local_b0,
                              (_Self *)&acs.Configs.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        AllConfigSource::AllConfigSource((AllConfigSource *)&entry.second);
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                 ::operator->(&local_a0);
        entry.second = (unsigned_long)pSVar4->Source;
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                 ::operator->(&local_a0);
        acs.Source._0_4_ = pSVar4->Kind;
        std::
        vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
        ::push_back(&this->AllConfigSources,(value_type *)&entry.second);
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                 ::operator->(&local_a0);
        sVar5 = std::
                vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                ::size(&this->AllConfigSources);
        local_f8 = sVar5 - 1;
        std::pair<const_cmSourceFile_*const,_unsigned_long>::
        pair<cmSourceFile_*const_&,_unsigned_long,_true>
                  ((pair<const_cmSourceFile_*const,_unsigned_long> *)local_f0,&pSVar4->Source,
                   &local_f8);
        _Var8 = std::
                map<cmSourceFile_const*,unsigned_long,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                ::insert<std::pair<cmSourceFile_const*const,unsigned_long>&>
                          ((map<cmSourceFile_const*,unsigned_long,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                            *)&ci,(pair<const_cmSourceFile_*const,_unsigned_long> *)local_f0);
        local_b0._M_node = (_Base_ptr)_Var8.first._M_node;
        AllConfigSource::~AllConfigSource((AllConfigSource *)&entry.second);
      }
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>::
               operator->(&local_b0);
      pvVar7 = std::
               vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
               ::operator[](&this->AllConfigSources,ppVar6->second);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&pvVar7->Configs,(value_type_conflict3 *)&sources);
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
      ::operator++(&local_a0);
    }
  }
  std::
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  ::~map((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
          *)&ci);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeAllConfigSources() const
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);

  std::map<cmSourceFile const*, size_t> index;

  for (size_t ci = 0; ci < configs.size(); ++ci) {
    KindedSources const& sources = this->GetKindedSources(configs[ci]);
    for (std::vector<cmGeneratorTarget::SourceAndKind>::const_iterator si =
           sources.Sources.begin();
         si != sources.Sources.end(); ++si) {
      std::map<cmSourceFile const*, size_t>::iterator mi =
        index.find(si->Source);
      if (mi == index.end()) {
        AllConfigSource acs;
        acs.Source = si->Source;
        acs.Kind = si->Kind;
        this->AllConfigSources.push_back(acs);
        std::map<cmSourceFile const*, size_t>::value_type entry(
          si->Source, this->AllConfigSources.size() - 1);
        mi = index.insert(entry).first;
      }
      this->AllConfigSources[mi->second].Configs.push_back(ci);
    }
  }
}